

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O3

void __thiscall LengauerTarjan::DFS(LengauerTarjan *this,int v)

{
  vector<int,std::allocator<int>> *this_00;
  uint uVar1;
  iterator __position;
  int iVar2;
  uint *puVar3;
  int local_24;
  
  iVar2 = this->count + 1;
  this->count = iVar2;
  (this->semi).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[v] = iVar2;
  (this->vertex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[this->count] = v;
  (this->label).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[v] = v;
  (this->ancestor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[v] = -1;
  puVar3 = (uint *)succs.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[v].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
  if (puVar3 != (uint *)succs.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[v].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
    local_24 = v;
    do {
      uVar1 = *puVar3;
      if ((this->semi).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[(int)uVar1] == -1) {
        (this->parent).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start[(int)uVar1] = local_24;
        (**this->_vptr_LengauerTarjan)(this,(ulong)uVar1);
      }
      this_00 = (vector<int,std::allocator<int>> *)
                (preds.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (int)uVar1);
      __position._M_current = *(int **)(this_00 + 8);
      if (__position._M_current == *(int **)(this_00 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this_00,__position,&local_24);
      }
      else {
        *__position._M_current = local_24;
        *(int **)(this_00 + 8) = __position._M_current + 1;
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != (uint *)succs.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[local_24].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void LengauerTarjan::DFS(int v) {
	// cout <<"DFS at "<<v<<endl;
	count = count + 1;
	semi[v] = count;
	vertex[count] = v;
	// Init vars for step 3 and 4
	label[v] = v;
	ancestor[v] = -1;
	std::vector<int>::iterator it;
	for (it = succs[v].begin(); it != succs[v].end(); it++) {
		const int w = *it;
		if (semi[w] == -1) {
			parent[w] = v;
			DFS(w);
		}
		preds[w].push_back(v);
	}
}